

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereClauseInsert(WhereClause *pWC,Expr *p,u8 wtFlags)

{
  WhereTerm *pWVar1;
  sqlite3 *db;
  int iVar2;
  WhereTerm *__dest;
  Expr *pEVar3;
  
  iVar2 = pWC->nTerm;
  if (pWC->nSlot <= iVar2) {
    pWVar1 = pWC->a;
    db = pWC->pParse->db;
    __dest = (WhereTerm *)sqlite3DbMallocRaw(db,pWC->nSlot * 0x70);
    pWC->a = __dest;
    if (__dest == (WhereTerm *)0x0) {
      if ((wtFlags & 1) != 0) {
        sqlite3ExprDelete(db,p);
      }
      pWC->a = pWVar1;
      return 0;
    }
    memcpy(__dest,pWVar1,(long)pWC->nTerm * 0x38);
    if (pWVar1 != pWC->aStatic) {
      sqlite3DbFree(db,pWVar1);
    }
    iVar2 = sqlite3DbMallocSize(db,pWC->a);
    pWC->nSlot = (int)((ulong)(long)iVar2 / 0x38);
    iVar2 = pWC->nTerm;
  }
  pWVar1 = pWC->a;
  pWC->nTerm = iVar2 + 1;
  pEVar3 = sqlite3ExprSkipCollate(p);
  pWVar1[iVar2].pExpr = pEVar3;
  pWVar1[iVar2].wtFlags = wtFlags;
  pWVar1[iVar2].pWC = pWC;
  pWVar1[iVar2].iParent = -1;
  return iVar2;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u8 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );  /* EV: R-00211-15100 */
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pParse->db;
    pWC->a = sqlite3DbMallocRaw(db, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    if( pOld!=pWC->aStatic ){
      sqlite3DbFree(db, pOld);
    }
    pWC->nSlot = sqlite3DbMallocSize(db, pWC->a)/sizeof(pWC->a[0]);
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  pTerm->pExpr = sqlite3ExprSkipCollate(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  return idx;
}